

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildProfiledElementCP
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,RegSlot regSlot,
          CacheId inlineCacheIndex,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  PropertyId propertyId;
  BOOL BVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *pJVar6;
  SymOpnd *srcOpnd;
  RegOpnd *dstOpnd;
  JITTimeProfileInfo *this_00;
  LdLenInfo *pLVar7;
  Instr *instr;
  OpCode local_36;
  bool local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [2];
  OpCode newOpcode_local;
  bool wasNotProfiled;
  ValueType arrayType;
  
  local_36 = newOpcode;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12d0,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004d96a2;
    *puVar5 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(&local_36);
  if (local_36 != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12d4,"(newOpcode == Js::OpCode::LdLen_A)",
                       "newOpcode == Js::OpCode::LdLen_A");
    if (!bVar2) goto LAB_004d96a2;
    *puVar5 = 0;
  }
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propertyId = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar6,inlineCacheIndex);
  pLVar7 = (LdLenInfo *)0x0;
  srcOpnd = BuildFieldOpnd(this,local_36,instance,propertyId,0xffffffff,PropertyKindData,
                           inlineCacheIndex);
  dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,false);
  bVar2 = profileId != 0xffff;
  local_32[0].field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::HasProfileInfo(pJVar6);
  if (bVar3) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar6);
    pLVar7 = JITTimeProfileInfo::GetLdLenInfo(this_00,profileId);
    local_32[0].field_0 = (pLVar7->arrayType).field_0.field_0;
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if (bVar3) {
      bVar3 = AllowNativeArrayProfileInfo(this);
      if (!bVar3) {
        local_32[0].field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetArrayTypeId((ValueType *)&local_32[0].field_0,TypeIds_Array);
      }
    }
    IR::Opnd::SetValueType(&srcOpnd->super_Opnd,(ValueType)local_32[0].field_0);
    BVar4 = Func::HasTry(this->m_func->topFunc);
    if (BVar4 != 0) {
      bVar2 = Func::DoOptimizeTry(this->m_func->topFunc);
      bVar2 = bVar2 && profileId != 0xffff;
    }
  }
  else {
    bVar2 = false;
  }
  local_33 = false;
  if (bVar2) {
    instr = BuildProfiledFieldLoad(this,local_36,dstOpnd,srcOpnd,inlineCacheIndex,&local_33);
  }
  else {
    instr = (Instr *)0x0;
  }
  if (instr == (Instr *)0x0) {
    instr = IR::Instr::New(local_36,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
  }
  else if (instr->m_kind == InstrKindProfiled) {
    *(anon_union_1_2_471f577c_for_LdLenInfo_1 *)((long)&instr[1]._vptr_Instr + 6) = pLVar7->field_1;
    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)&instr[1]._vptr_Instr + 4) =
         (pLVar7->arrayType).field_0;
    if (instr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) {
LAB_004d96a2:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)&instr[1]._vptr_Instr + 4) = local_32[0];
  }
  else if (instr->m_kind == InstrKindJitProfiling) {
    *(ProfileId *)&instr[1]._vptr_Instr = profileId;
  }
  AddInstr(this,instr,offset);
  if (local_33 == true) {
    bVar2 = DoBailOnNoProfile(this);
    if (bVar2) {
      InsertBailOnNoProfile(this,instr);
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledElementCP(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::RegSlot regSlot, Js::CacheId inlineCacheIndex, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);

    Assert(newOpcode == Js::OpCode::LdLen_A);

    Js::PropertyId propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(inlineCacheIndex);
    IR::SymOpnd * fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, inlineCacheIndex);
    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(regSlot);

    bool isProfiled = (profileId != Js::Constants::NoProfileId);
    ValueType arrayType = ValueType::Uninitialized;
    const Js::LdLenInfo * ldLenInfo = nullptr;

    if (m_func->HasProfileInfo())
    {
        ldLenInfo = m_func->GetReadOnlyProfileInfo()->GetLdLenInfo(profileId);
        arrayType = (ldLenInfo->GetArrayType());
        if (arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
        {
            // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the ProfiledInstr.
            arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);
        }

        fieldSymOpnd->SetValueType(arrayType);

        if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
        {
            isProfiled = false;
        }
    }
    else
    {
        isProfiled = false;
    }
    
    bool wasNotProfiled = false;
    IR::Instr *instr = nullptr;

    if (isProfiled)
    {
        instr = this->BuildProfiledFieldLoad(newOpcode, dstOpnd, fieldSymOpnd, inlineCacheIndex, &wasNotProfiled);
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, fieldSymOpnd, m_func);
    }
    else if (instr->IsJitProfilingInstr())
    {
        instr->AsJitProfilingInstr()->profileId = profileId;
    }
    else if (instr->IsProfiledInstr())
    {
        instr->AsProfiledInstr()->u.LdLenInfo() = *ldLenInfo;
        instr->AsProfiledInstr()->u.LdLenInfo().arrayType = arrayType;
    }

    this->AddInstr(instr, offset);

    if (wasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}